

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

VkImageUsageFlags vkt::memory::anon_unknown_0::usageToImageUsageFlags(Usage usage)

{
  Usage UVar1;
  uint local_10;
  VkImageUsageFlags flags;
  Usage usage_local;
  
  UVar1 = operator&(usage,USAGE_TRANSFER_SRC);
  local_10 = (uint)(UVar1 != 0);
  UVar1 = operator&(usage,USAGE_TRANSFER_DST);
  if (UVar1 != 0) {
    local_10 = local_10 | 2;
  }
  UVar1 = operator&(usage,USAGE_SAMPLED_IMAGE);
  if (UVar1 != 0) {
    local_10 = local_10 | 4;
  }
  UVar1 = operator&(usage,USAGE_STORAGE_IMAGE);
  if (UVar1 != 0) {
    local_10 = local_10 | 8;
  }
  UVar1 = operator&(usage,USAGE_COLOR_ATTACHMENT);
  if (UVar1 != 0) {
    local_10 = local_10 | 0x10;
  }
  UVar1 = operator&(usage,USAGE_INPUT_ATTACHMENT);
  if (UVar1 != 0) {
    local_10 = local_10 | 0x80;
  }
  UVar1 = operator&(usage,USAGE_DEPTH_STENCIL_ATTACHMENT);
  if (UVar1 != 0) {
    local_10 = local_10 | 0x20;
  }
  return local_10;
}

Assistant:

vk::VkImageUsageFlags usageToImageUsageFlags (Usage usage)
{
	vk::VkImageUsageFlags flags = 0;

	if (usage & USAGE_TRANSFER_SRC)
		flags |= vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT;

	if (usage & USAGE_TRANSFER_DST)
		flags |= vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT;

	if (usage & USAGE_SAMPLED_IMAGE)
		flags |= vk::VK_IMAGE_USAGE_SAMPLED_BIT;

	if (usage & USAGE_STORAGE_IMAGE)
		flags |= vk::VK_IMAGE_USAGE_STORAGE_BIT;

	if (usage & USAGE_COLOR_ATTACHMENT)
		flags |= vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT;

	if (usage & USAGE_INPUT_ATTACHMENT)
		flags |= vk::VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT;

	if (usage & USAGE_DEPTH_STENCIL_ATTACHMENT)
		flags |= vk::VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT;

	return flags;
}